

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O1

kexinit_algorithm * ssh2_kexinit_addalg(kexinit_algorithm_list *list,char *name)

{
  size_t sVar1;
  _Bool _Var2;
  size_t sVar3;
  kexinit_algorithm *pkVar4;
  kexinit_algorithm *unaff_R12;
  long lVar5;
  bool bVar6;
  ptrlen pl2;
  ptrlen pl2_00;
  ptrlen pl1;
  
  sVar3 = strlen(name);
  bVar6 = list->nalgs != 0;
  if (bVar6) {
    pl2.len = sVar3;
    pl2.ptr = name;
    _Var2 = ptrlen_eq_ptrlen(list->algs->name,pl2);
    if (_Var2) {
      unaff_R12 = (kexinit_algorithm *)0x0;
    }
    else {
      lVar5 = 0x28;
      unaff_R12 = (kexinit_algorithm *)0x0;
      do {
        unaff_R12 = (kexinit_algorithm *)((long)&(unaff_R12->name).ptr + 1);
        bVar6 = unaff_R12 < (kexinit_algorithm *)list->nalgs;
        if (!bVar6) goto LAB_0012ed3a;
        pl2_00.len = sVar3;
        pl2_00.ptr = name;
        pl1.len = *(size_t *)((long)&(list->algs->name).ptr + lVar5);
        pl1.ptr = *(void **)((long)list->algs + lVar5 + -8);
        _Var2 = ptrlen_eq_ptrlen(pl1,pl2_00);
        lVar5 = lVar5 + 0x20;
      } while (!_Var2);
    }
    unaff_R12 = list->algs + (long)unaff_R12;
  }
LAB_0012ed3a:
  if (!bVar6) {
    pkVar4 = (kexinit_algorithm *)safegrowarray(list->algs,&list->algsize,0x20,list->nalgs,1,false);
    list->algs = pkVar4;
    sVar1 = list->nalgs;
    list->nalgs = sVar1 + 1;
    unaff_R12 = pkVar4 + sVar1;
    pkVar4[sVar1].name.ptr = name;
    pkVar4[sVar1].name.len = sVar3;
  }
  return unaff_R12;
}

Assistant:

static struct kexinit_algorithm *ssh2_kexinit_addalg(
    struct kexinit_algorithm_list *list, const char *name)
{
    return ssh2_kexinit_addalg_pl(list, ptrlen_from_asciz(name));
}